

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

NodeSequence __thiscall
GraphBuilder::insertPthreadExit(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  CallNode *node;
  type *node_00;
  Node *node_01;
  NodeSequence NVar2;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)callInstruction);
  if (pFVar1 == (Function *)0x0) {
    node = createNode<(NodeType)7,decltype(nullptr),llvm::CallInst_const*>
                     ((void *)0x0,callInstruction);
  }
  else {
    node = createNode<(NodeType)7,llvm::CallInst_const*>(callInstruction);
  }
  NVar2.first = &addNode<CallNode>(this,node)->super_Node;
  node_00 = createNode<(NodeType)10>();
  node_01 = &addNode<ReturnNode>(this,node_00)->super_Node;
  Node::addSuccessor(NVar2.first,node_01);
  NVar2.second = node_01;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadExit(const CallInst *callInstruction) {
    CallNode *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = addNode(createNode<NodeType::CALL>(callInstruction));
    } else {
        callNode =
                addNode(createNode<NodeType::CALL>(nullptr, callInstruction));
    }
    auto *returnNode = addNode(createNode<NodeType::RETURN>());
    callNode->addSuccessor(returnNode);
    return {callNode, returnNode};
}